

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_io_primitive_haltPrintingBacktrace
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 0) {
    sysbvm_error_argumentCountMismatch(0,argumentCount);
  }
  sysbvm_backtrace_print();
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_haltPrintingBacktrace(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    sysbvm_backtrace_print();
    return SYSBVM_VOID_TUPLE;
}